

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void xmrig::ClientWriteBaton::onWrite(uv_write_t *req,int param_2)

{
  void *pvVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    ~ClientWriteBaton((ClientWriteBaton *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

inline static void onWrite(uv_write_t *req, int) { delete reinterpret_cast<ClientWriteBaton *>(req->data); }